

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::initStruct
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          StructSize size)

{
  WirePointer *ref;
  word *pwVar1;
  undefined1 local_58 [8];
  StructBuilder builder;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  StructSize size_local;
  OrphanBuilder *result;
  
  builder._39_1_ = 0;
  OrphanBuilder(__return_storage_ptr__);
  ref = tagAsPtr(__return_storage_ptr__);
  WireHelpers::initStructPointer
            ((StructBuilder *)local_58,ref,(SegmentBuilder *)0x0,capTable,size,arena);
  __return_storage_ptr__->segment = (SegmentBuilder *)local_58;
  __return_storage_ptr__->capTable = capTable;
  pwVar1 = StructBuilder::getLocation((StructBuilder *)local_58);
  __return_storage_ptr__->location = pwVar1;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStruct(
    BuilderArena* arena, CapTableBuilder* capTable, StructSize size) {
  OrphanBuilder result;
  StructBuilder builder = WireHelpers::initStructPointer(
      result.tagAsPtr(), nullptr, capTable, size, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}